

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::NamedBase::NamedBase(NamedBase *this,string *name_,string *help_,Options options_)

{
  Options options__local;
  string *help__local;
  string *name__local;
  NamedBase *this_local;
  
  Base::Base(&this->super_Base,help_,options_);
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__NamedBase_0013fa78;
  std::__cxx11::string::string((string *)&this->name,(string *)name_);
  this->kickout = false;
  std::__cxx11::string::string((string *)&this->defaultString);
  this->defaultStringManual = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->choicesStrings);
  this->choicesStringManual = false;
  return;
}

Assistant:

NamedBase(const std::string &name_, const std::string &help_, Options options_ = {}) : Base(help_, options_), name(name_) {}